

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Teleport_ZombieChanger
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *this;
  FState *newstate;
  FName local_34;
  int local_30;
  int local_2c;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (it == (AActor *)0x0) {
    ln_local._4_4_ = 0;
  }
  else {
    local_30 = arg2;
    local_2c = arg1;
    arg2_local = arg0;
    arg1_local._3_1_ = backSide;
    _arg0_local = it;
    it_local = (AActor *)ln;
    EV_Teleport(arg0,arg1,ln,(uint)backSide,it,0);
    this = _arg0_local;
    if (-1 < _arg0_local->health) {
      FName::FName(&local_34,NAME_Pain);
      newstate = AActor::FindState(this,&local_34);
      AActor::SetState(this,newstate,false);
    }
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Teleport_ZombieChanger)
// Teleport_ZombieChanger (tid, sectortag)
{
	// This is practically useless outside of Strife, but oh well.
	if (it != NULL)
	{
		EV_Teleport (arg0, arg1, ln, backSide, it, 0);
		if (it->health >= 0) it->SetState (it->FindState(NAME_Pain));
		return true;
	}
	return false;
}